

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O0

JsErrorCode JsExternalizeArrayBuffer(JsValueRef arrayBufferVar)

{
  JsValueRef local_18;
  JsValueRef arrayBufferVar_local;
  
  if (arrayBufferVar == (JsValueRef)0x0) {
    arrayBufferVar_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    local_18 = arrayBufferVar;
    arrayBufferVar_local._4_4_ =
         ContextAPINoScriptWrapper_NoRecord<JsExternalizeArrayBuffer::__0>
                   ((anon_class_8_1_c3e4f6ac)&local_18,false,false);
  }
  return arrayBufferVar_local._4_4_;
}

Assistant:

CHAKRA_API
JsExternalizeArrayBuffer(
    _In_ JsValueRef arrayBufferVar)
{
    VALIDATE_JSREF(arrayBufferVar);
    return ContextAPINoScriptWrapper_NoRecord([&](Js::ScriptContext *scriptContext) -> JsErrorCode {

        Js::ArrayBuffer* arrayBuffer = Js::JavascriptOperators::TryFromVar<Js::ArrayBuffer>(arrayBufferVar);
        if (!arrayBuffer)
        {
            return JsErrorInvalidArgument;
        }

        arrayBuffer->Externalize();

        return JsNoError;
    });
}